

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplerBindingRenderCase::deinit
          (SamplerBindingRenderCase *this)

{
  pointer puVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  int i;
  long lVar4;
  
  LayoutBindingRenderCase::deinit(&this->super_LayoutBindingRenderCase);
  lVar3 = 0;
  lVar4 = 0;
  while( true ) {
    puVar1 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_textures).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar1) >> 2) <= lVar4) break;
    if (*(int *)((long)puVar1 + lVar3) != 0) {
      iVar2 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
                _vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x480))
                (1,(long)(this->m_textures).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar3);
      iVar2 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
                _vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0xb8))(this->m_textureType,0);
    }
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 4;
  }
  return;
}

Assistant:

void SamplerBindingRenderCase::deinit(void)
{
	LayoutBindingRenderCase::deinit();

	// Clean up texture data
	for (int i = 0; i < (int)m_textures.size(); ++i)
	{
		if (m_textures[i])
		{
			m_context.getRenderContext().getFunctions().deleteTextures(1, &m_textures[i]);
			m_context.getRenderContext().getFunctions().bindTexture(m_textureType, 0);
		}
	}
}